

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::set_key_ref(Tree *this,size_t node,csubstr ref)

{
  NodeData *pNVar1;
  code *pcVar2;
  bool bVar3;
  NodeType_e f;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((~(int)this->m_buf[node].m_type.type & 0x102U) == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: ! has_key_anchor(node)",0x24,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NodeScalar::set_ref_maybe_replacing_scalar
            (&this->m_buf[node].m_key,ref,
             SUB41((uint)((int)this->m_buf[node].m_type.type & KEY) >> 1,0));
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  f = pNVar1[node].m_type.type | (KEYREF|KEY);
  _check_next_flags(this,node,f);
  pNVar1[node].m_type.type = f;
  return;
}

Assistant:

void set_key_ref   (size_t node, csubstr ref   ) { RYML_ASSERT( ! has_key_anchor(node)); NodeData* C4_RESTRICT n = _p(node); n->m_key.set_ref_maybe_replacing_scalar(ref, n->m_type.has_key()); _add_flags(node, KEY|KEYREF); }